

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_priority_deque.cpp
# Opt level: O0

bool (anonymous_namespace)::
     have_same_elements<boost::container::priority_deque<int,std::vector<int,std::allocator<int>>,std::less<int>>,int>
               (priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> *values
               ,multiset<int,_std::less<int>,_std::allocator<int>_> *rf)

{
  bool bVar1;
  reference __x;
  _Self local_40;
  _Self local_38;
  set_itr_t set_it;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  itr_t it;
  multiset<int,_std::less<int>,_std::allocator<int>_> *rf_local;
  priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> *values_local;
  
  it._M_current = (int *)rf;
  local_28._M_current =
       (int *)boost::container::
              priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>::begin
                        (values);
  while( true ) {
    set_it._M_node =
         (_Base_ptr)
         boost::container::
         priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>::end(values);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &set_it);
    if (!bVar1) {
      bVar1 = std::multiset<int,_std::less<int>,_std::allocator<int>_>::empty(rf);
      return bVar1;
    }
    __x = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator*(&local_28);
    local_38._M_node =
         (_Base_ptr)std::multiset<int,_std::less<int>,_std::allocator<int>_>::find(rf,__x);
    local_40._M_node = (_Base_ptr)std::multiset<int,_std::less<int>,_std::allocator<int>_>::end(rf);
    bVar1 = std::operator==(&local_38,&local_40);
    if (bVar1) break;
    std::multiset<int,std::less<int>,std::allocator<int>>::erase_abi_cxx11_
              ((multiset<int,std::less<int>,std::allocator<int>> *)rf,
               (const_iterator)local_38._M_node);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_28);
  }
  return false;
}

Assistant:

bool have_same_elements(T const & values, std::multiset<T2> rf)
{
  typedef typename T::const_iterator itr_t;
  for (itr_t it = values.begin(); it != values.end(); ++it)
  {
    typedef typename std::multiset<T2>::iterator set_itr_t;
    set_itr_t set_it = rf.find(*it);
    if (set_it == rf.end())
      return false;
    else
      rf.erase(set_it);
  }
  return rf.empty();
}